

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall
problem_parser::append_to_objective(problem_parser *this,function_element_token *elem)

{
  double dVar1;
  bool bVar2;
  pointer poVar3;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_60;
  int local_54;
  objective_function_element *local_50;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_48;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_40;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  it;
  anon_class_4_1_3fcf65d9_for__M_pred local_24;
  function_element_token *pfStack_20;
  int id;
  function_element_token *elem_local;
  problem_parser *this_local;
  
  pfStack_20 = elem;
  elem_local = (function_element_token *)this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&elem->name);
  if (bVar2) {
    (this->m_problem).objective.value = pfStack_20->factor + (this->m_problem).objective.value;
    this_local._7_1_ = true;
  }
  else {
    it._M_current = (objective_function_element *)(pfStack_20->name)._M_len;
    local_24.id = get_or_assign_variable(this,pfStack_20->name);
    if (local_24.id == -1) {
      this_local._7_1_ = false;
    }
    else {
      local_48._M_current =
           (objective_function_element *)
           std::
           begin<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                     (&(this->m_problem).objective.elements);
      local_50 = (objective_function_element *)
                 std::
                 end<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                           (&(this->m_problem).objective.elements);
      local_54 = local_24.id;
      local_40 = std::
                 find_if<__gnu_cxx::__normal_iterator<baryonyx::objective_function_element*,std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>,problem_parser::append_to_objective(function_element_token_const&)::_lambda(auto:1_const&)_1_>
                           (local_48,(__normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                                      )local_50,local_24);
      local_60._M_current =
           (objective_function_element *)
           std::
           end<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                     (&(this->m_problem).objective.elements);
      bVar2 = __gnu_cxx::
              operator==<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                        (&local_40,&local_60);
      if (bVar2) {
        std::
        vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
        ::emplace_back<double_const&,int&>
                  ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                    *)&(this->m_problem).objective,&pfStack_20->factor,&local_24.id);
      }
      else {
        dVar1 = pfStack_20->factor;
        poVar3 = __gnu_cxx::
                 __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                 ::operator->(&local_40);
        poVar3->factor = dVar1 + poVar3->factor;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] bool append_to_objective(const function_element_token& elem)
    {
        if (elem.name.empty()) {
            m_problem.objective.value += elem.factor;
            return true;
        } else {
            auto id = get_or_assign_variable(elem.name);
            if (id == -1)
                return false;

            auto it = std::find_if(
              std::begin(m_problem.objective.elements),
              std::end(m_problem.objective.elements),
              [id](const auto& elem) { return elem.variable_index == id; });

            if (it == std::end(m_problem.objective.elements))
                m_problem.objective.elements.emplace_back(elem.factor, id);
            else
                it->factor += elem.factor;

            return true;
        }
    }